

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r,secp256k1_ge_storage *pre,int n,int w)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  undefined4 in_register_0000000c;
  secp256k1_fe *a;
  ulong uVar6;
  secp256k1_ge *a_00;
  ulong uVar7;
  secp256k1_ge *a_01;
  uint64_t uVar8;
  secp256k1_gej *a_02;
  ulong uVar9;
  secp256k1_gej *a_03;
  secp256k1_ge *a_04;
  ulong uVar10;
  secp256k1_gej *r_00;
  secp256k1_gej *psVar11;
  secp256k1_gej *psVar12;
  secp256k1_gej *a_05;
  secp256k1_fe sStack_338;
  secp256k1_fe sStack_308;
  secp256k1_gej *psStack_2d8;
  secp256k1_gej *psStack_2d0;
  secp256k1_gej *psStack_2c8;
  secp256k1_gej *psStack_2c0;
  secp256k1_gej *psStack_2b8;
  ulong uStack_2b0;
  secp256k1_gej *psStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_gej *psStack_298;
  uint64_t uStack_290;
  uint64_t uStack_288;
  secp256k1_gej *psStack_280;
  secp256k1_gej *psStack_278;
  secp256k1_fe *psStack_270;
  secp256k1_gej *psStack_268;
  undefined1 auStack_260 [56];
  uint64_t uStack_228;
  uint64_t uStack_220;
  uint64_t uStack_218;
  uint64_t uStack_210;
  int iStack_208;
  undefined1 auStack_200 [56];
  uint64_t uStack_1c8;
  secp256k1_gej *psStack_1c0;
  secp256k1_gej *psStack_1b8;
  secp256k1_gej *psStack_1b0;
  ulong uStack_1a8;
  undefined1 auStack_1a0 [56];
  secp256k1_gej *psStack_168;
  uint64_t uStack_160;
  secp256k1_gej *psStack_158;
  ulong uStack_150;
  ulong uStack_148;
  secp256k1_fe sStack_140;
  secp256k1_fe sStack_110;
  secp256k1_fe sStack_e0;
  secp256k1_fe sStack_b0;
  uint64_t uStack_80;
  uint64_t uStack_78;
  uint64_t uStack_70;
  uint64_t uStack_68;
  uint64_t uStack_60;
  ulong uStack_58;
  
  a = (secp256k1_fe *)CONCAT44(in_register_0000000c,w);
  if ((n & 1U) == 0) {
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_0011967e:
    secp256k1_ecmult_table_get_ge_storage_cold_2();
  }
  else {
    if (n < -7) goto LAB_0011967e;
    if (n < 8) {
      if (n < 1) {
        secp256k1_ge_from_storage(r,pre + ((uint)~n >> 1));
        secp256k1_fe_verify(&r->y);
        secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)(r->y).magnitude,1);
        uVar8 = (r->y).n[1];
        uVar2 = (r->y).n[2];
        uVar3 = (r->y).n[3];
        (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
        (r->y).n[1] = 0x3ffffffffffffc - uVar8;
        (r->y).n[2] = 0x3ffffffffffffc - uVar2;
        (r->y).n[3] = 0x3ffffffffffffc - uVar3;
        (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
        (r->y).magnitude = 2;
        (r->y).normalized = 0;
        secp256k1_fe_verify(&r->y);
        return;
      }
      secp256k1_ge_from_storage(r,pre + (n - 1U >> 1));
      return;
    }
  }
  secp256k1_ecmult_table_get_ge_storage_cold_1();
  psStack_2b8 = (secp256k1_gej *)0x1196ad;
  secp256k1_gej_verify((secp256k1_gej *)pre);
  psStack_2b8 = (secp256k1_gej *)0x1196b5;
  secp256k1_ge_verify(a_00);
  psStack_2b8 = (secp256k1_gej *)0x1196bd;
  secp256k1_fe_verify(a);
  if (((secp256k1_gej *)pre)->infinity != 0) {
    ((secp256k1_gej *)r)->infinity = a_00->infinity;
    psStack_2b8 = (secp256k1_gej *)0x1196e9;
    secp256k1_fe_sqr(&sStack_140,a);
    psStack_2b8 = (secp256k1_gej *)0x1196ff;
    secp256k1_fe_mul(&sStack_b0,&sStack_140,a);
    psStack_2b8 = (secp256k1_gej *)0x11970d;
    secp256k1_fe_mul(&r->x,&a_00->x,&sStack_140);
    psStack_2b8 = (secp256k1_gej *)0x119720;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->y,&a_00->y,&sStack_b0);
    psVar12 = (secp256k1_gej *)&((secp256k1_gej *)r)->z;
    (((secp256k1_gej *)r)->z).n[0] = 1;
    (((secp256k1_gej *)r)->z).n[1] = 0;
    (((secp256k1_gej *)r)->z).n[2] = 0;
    (((secp256k1_gej *)r)->z).n[3] = 0;
    (((secp256k1_gej *)r)->z).n[4] = 0;
    (((secp256k1_gej *)r)->z).magnitude = 1;
    (((secp256k1_gej *)r)->z).normalized = 1;
LAB_0011974b:
    psStack_2b8 = (secp256k1_gej *)0x119750;
    secp256k1_fe_verify(&psVar12->x);
    psStack_2b8 = (secp256k1_gej *)0x119758;
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  if (a_00->infinity != 0) {
    memcpy(r,pre,0x98);
    return;
  }
  psStack_270 = &((secp256k1_gej *)pre)->z;
  psStack_2b8 = (secp256k1_gej *)0x1197af;
  secp256k1_fe_mul(&sStack_140,psStack_270,a);
  psStack_2b8 = (secp256k1_gej *)0x1197c2;
  secp256k1_fe_sqr(&sStack_b0,&sStack_140);
  sStack_110.n[0] = (((secp256k1_gej *)pre)->x).n[0];
  sStack_110.n[1] = (((secp256k1_gej *)pre)->x).n[1];
  sStack_110.n[2] = (((secp256k1_gej *)pre)->x).n[2];
  sStack_110.n[3] = (((secp256k1_gej *)pre)->x).n[3];
  sStack_110.n[4] = (((secp256k1_gej *)pre)->x).n[4];
  sStack_110.magnitude = (((secp256k1_gej *)pre)->x).magnitude;
  sStack_110.normalized = (((secp256k1_gej *)pre)->x).normalized;
  psStack_2b8 = (secp256k1_gej *)0x1197f7;
  secp256k1_fe_mul((secp256k1_fe *)auStack_200,&a_00->x,&sStack_b0);
  auStack_260._0_8_ = (((secp256k1_gej *)pre)->y).n[0];
  auStack_260._8_8_ = (((secp256k1_gej *)pre)->y).n[1];
  auStack_260._16_8_ = (((secp256k1_gej *)pre)->y).n[2];
  auStack_260._24_8_ = (((secp256k1_gej *)pre)->y).n[3];
  auStack_260._32_8_ = (((secp256k1_gej *)pre)->y).n[4];
  auStack_260._40_4_ = (((secp256k1_gej *)pre)->y).magnitude;
  auStack_260._44_4_ = (((secp256k1_gej *)pre)->y).normalized;
  psStack_2b8 = (secp256k1_gej *)0x119838;
  psStack_2a8 = (secp256k1_gej *)pre;
  secp256k1_fe_mul(&sStack_e0,&a_00->y,&sStack_b0);
  psStack_2b8 = (secp256k1_gej *)0x11984b;
  secp256k1_fe_mul(&sStack_e0,&sStack_e0,&sStack_140);
  psStack_2b8 = (secp256k1_gej *)0x119853;
  secp256k1_fe_verify(&sStack_110);
  a_02 = (secp256k1_gej *)0x4;
  psStack_2b8 = (secp256k1_gej *)0x119860;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(sStack_110._40_8_ & 0xffffffff),4);
  psVar12 = (secp256k1_gej *)(0x9ffff5ffffd9d6 - sStack_110.n[0]);
  psVar11 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_110.n[1]);
  uVar8 = 0x9ffffffffffff6 - sStack_110.n[2];
  r_00 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_110.n[3]);
  uStack_2b0 = 0x9fffffffffff6 - sStack_110.n[4];
  uStack_148 = 5;
  psStack_2b8 = (secp256k1_gej *)0x1198cd;
  auStack_1a0._48_8_ = psVar12;
  psStack_168 = psVar11;
  uStack_160 = uVar8;
  psStack_158 = r_00;
  uStack_150 = uStack_2b0;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
  psStack_2b8 = (secp256k1_gej *)0x1198d5;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
  a_05 = (secp256k1_gej *)auStack_200;
  psStack_2b8 = (secp256k1_gej *)0x1198e5;
  a_03 = a_05;
  secp256k1_fe_verify((secp256k1_fe *)a_05);
  if ((int)auStack_200._40_4_ < 0x1c) {
    psStack_268 = (secp256k1_gej *)((long)(psVar12->x).n + auStack_200._0_8_);
    psStack_278 = (secp256k1_gej *)((long)(psVar11->x).n + auStack_200._8_8_);
    uStack_288 = uVar8 + auStack_200._16_8_;
    psStack_280 = (secp256k1_gej *)((long)(r_00->x).n + auStack_200._24_8_);
    uStack_2b0 = uStack_2b0 + auStack_200._32_8_;
    uStack_148 = (ulong)(auStack_200._40_4_ + 5);
    psStack_2b8 = (secp256k1_gej *)0x119963;
    auStack_1a0._48_8_ = psStack_268;
    psStack_168 = psStack_278;
    uStack_160 = uStack_288;
    psStack_158 = psStack_280;
    uStack_150 = uStack_2b0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
    psStack_2b8 = (secp256k1_gej *)0x119973;
    secp256k1_fe_verify(&sStack_e0);
    a_02 = (secp256k1_gej *)0x1;
    psStack_2b8 = (secp256k1_gej *)0x119981;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)sStack_e0.magnitude,1);
    r_00 = (secp256k1_gej *)(0x3ffffbfffff0bc - sStack_e0.n[0]);
    psVar11 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_e0.n[2]);
    a_05 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_e0.n[3]);
    psVar12 = (secp256k1_gej *)(0x3fffffffffffc - sStack_e0.n[4]);
    uStack_1a8 = 2;
    psStack_2b8 = (secp256k1_gej *)0x1199e3;
    auStack_200._48_8_ = r_00;
    uStack_1c8 = 0x3ffffffffffffc - sStack_e0.n[1];
    psStack_1c0 = psVar11;
    psStack_1b8 = a_05;
    psStack_1b0 = psVar12;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
    psStack_2b8 = (secp256k1_gej *)0x1199f0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
    a_03 = (secp256k1_gej *)auStack_260;
    psStack_2b8 = (secp256k1_gej *)0x1199fa;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (0x1e < (int)auStack_260._40_4_) goto LAB_00119ef9;
    psStack_298 = (secp256k1_gej *)((long)(r_00->x).n + auStack_260._0_8_);
    uStack_290 = (0x3ffffffffffffc - sStack_e0.n[1]) + auStack_260._8_8_;
    psStack_2a0 = (secp256k1_gej *)((long)(psVar11->x).n + auStack_260._16_8_);
    psVar11 = (secp256k1_gej *)((long)(a_05->x).n + auStack_260._24_8_);
    psVar12 = (secp256k1_gej *)((long)(psVar12->x).n + auStack_260._32_8_);
    uStack_1a8 = (ulong)(auStack_260._40_4_ + 2);
    psStack_2b8 = (secp256k1_gej *)0x119a63;
    auStack_200._48_8_ = psStack_298;
    uStack_1c8 = uStack_290;
    psStack_1c0 = psStack_2a0;
    psStack_1b8 = psVar11;
    psStack_1b0 = psVar12;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
    psStack_2b8 = (secp256k1_gej *)0x119a70;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
    uVar5 = (uStack_2b0 >> 0x30) * 0x1000003d1 + (long)psStack_268;
    if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar5 & 0xfffffffffffff) == 0)) {
      uVar10 = (long)(psStack_278->x).n + (uVar5 >> 0x34);
      uVar6 = (uVar10 >> 0x34) + uStack_288;
      uVar7 = (long)(psStack_280->x).n + (uVar6 >> 0x34);
      uVar9 = (uVar7 >> 0x34) + (uStack_2b0 & 0xffffffffffff);
      if ((((uVar10 | uVar5 | uVar6 | uVar7) & 0xfffffffffffff) == 0 && uVar9 == 0) ||
         (((uVar5 | 0x1000003d0) & uVar10 & uVar6 & uVar7 & (uVar9 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_2b8 = (secp256k1_gej *)0x119e35;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
        uVar5 = ((ulong)psVar12 >> 0x30) * 0x1000003d1 + (long)psStack_298;
        if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar5 & 0xfffffffffffff) == 0)) {
          uVar10 = uStack_290 + (uVar5 >> 0x34);
          uVar6 = (long)(psStack_2a0->x).n + (uVar10 >> 0x34);
          uVar7 = (long)(psVar11->x).n + (uVar6 >> 0x34);
          uVar9 = (uVar7 >> 0x34) + ((ulong)psVar12 & 0xffffffffffff);
          if ((((uVar10 | uVar5 | uVar6 | uVar7) & 0xfffffffffffff) == 0 && uVar9 == 0) ||
             (((uVar5 | 0x1000003d0) & uVar10 & uVar6 & uVar7 & (uVar9 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            psStack_2b8 = (secp256k1_gej *)0x119eef;
            secp256k1_gej_double_var((secp256k1_gej *)r,psStack_2a8,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_2b8 = (secp256k1_gej *)0x119edb;
        secp256k1_gej_set_infinity((secp256k1_gej *)r);
        return;
      }
    }
    ((secp256k1_gej *)r)->infinity = 0;
    a_05 = (secp256k1_gej *)(auStack_1a0 + 0x30);
    psStack_2b8 = (secp256k1_gej *)0x119b57;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->z,psStack_270,(secp256k1_fe *)a_05);
    psVar12 = (secp256k1_gej *)&stack0xffffffffffffff80;
    psStack_2b8 = (secp256k1_gej *)0x119b6a;
    secp256k1_fe_sqr((secp256k1_fe *)psVar12,(secp256k1_fe *)a_05);
    psStack_2b8 = (secp256k1_gej *)0x119b72;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    psStack_2b8 = (secp256k1_gej *)0x119b80;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(uStack_58 & 0xffffffff),1);
    uStack_80 = 0x3ffffbfffff0bc - uStack_80;
    uStack_78 = 0x3ffffffffffffc - uStack_78;
    uStack_70 = 0x3ffffffffffffc - uStack_70;
    uStack_68 = 0x3ffffffffffffc - uStack_68;
    uStack_60 = 0x3fffffffffffc - uStack_60;
    uStack_58 = 2;
    psStack_2b8 = (secp256k1_gej *)0x119bc8;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    r_00 = (secp256k1_gej *)(auStack_260 + 0x30);
    psStack_2b8 = (secp256k1_gej *)0x119bde;
    secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)psVar12,(secp256k1_fe *)a_05);
    psStack_2b8 = (secp256k1_gej *)0x119bf6;
    secp256k1_fe_mul((secp256k1_fe *)auStack_1a0,&sStack_110,(secp256k1_fe *)psVar12);
    a_02 = (secp256k1_gej *)(auStack_200 + 0x30);
    psStack_2b8 = (secp256k1_gej *)0x119c06;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)a_02);
    psStack_2b8 = (secp256k1_gej *)0x119c0e;
    secp256k1_fe_verify(&r->x);
    psStack_2b8 = (secp256k1_gej *)0x119c16;
    a_03 = r_00;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    iVar4 = iStack_208 + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar4) goto LAB_00119efe;
    uVar8 = (((secp256k1_gej *)r)->x).n[1];
    uVar2 = (((secp256k1_gej *)r)->x).n[2];
    uVar3 = (((secp256k1_gej *)r)->x).n[3];
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_260._48_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar8 + uStack_228;
    (((secp256k1_gej *)r)->x).n[2] = uVar2 + uStack_220;
    (((secp256k1_gej *)r)->x).n[3] = uVar3 + uStack_218;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + uStack_210;
    (((secp256k1_gej *)r)->x).magnitude = iVar4;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_2b8 = (secp256k1_gej *)0x119c69;
    secp256k1_fe_verify(&r->x);
    psStack_2b8 = (secp256k1_gej *)0x119c71;
    secp256k1_fe_verify(&r->x);
    psVar12 = (secp256k1_gej *)auStack_1a0;
    psStack_2b8 = (secp256k1_gej *)0x119c81;
    a_03 = psVar12;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    iVar4 = auStack_1a0._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar4) goto LAB_00119f03;
    uVar8 = (((secp256k1_gej *)r)->x).n[1];
    uVar2 = (((secp256k1_gej *)r)->x).n[2];
    uVar3 = (((secp256k1_gej *)r)->x).n[3];
    psVar12 = (secp256k1_gej *)auStack_1a0;
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar8 + auStack_1a0._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar2 + auStack_1a0._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar3 + auStack_1a0._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_1a0._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar4;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_2b8 = (secp256k1_gej *)0x119cd0;
    secp256k1_fe_verify(&r->x);
    psStack_2b8 = (secp256k1_gej *)0x119cd8;
    secp256k1_fe_verify(&r->x);
    psStack_2b8 = (secp256k1_gej *)0x119ce0;
    a_03 = psVar12;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    iVar4 = auStack_1a0._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar4) goto LAB_00119f08;
    uVar8 = (((secp256k1_gej *)r)->x).n[1];
    uVar2 = (((secp256k1_gej *)r)->x).n[2];
    uVar3 = (((secp256k1_gej *)r)->x).n[3];
    psVar12 = (secp256k1_gej *)auStack_1a0;
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar8 + auStack_1a0._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar2 + auStack_1a0._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar3 + auStack_1a0._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_1a0._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar4;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_2b8 = (secp256k1_gej *)0x119d2f;
    secp256k1_fe_verify(&r->x);
    psStack_2b8 = (secp256k1_gej *)0x119d37;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    psStack_2b8 = (secp256k1_gej *)0x119d3f;
    a_03 = (secp256k1_gej *)r;
    secp256k1_fe_verify(&r->x);
    iVar4 = (((secp256k1_gej *)r)->x).magnitude + auStack_1a0._40_4_;
    if (iVar4 < 0x21) {
      auStack_1a0._0_8_ = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
      auStack_1a0._8_8_ = (((secp256k1_gej *)r)->x).n[1] + auStack_1a0._8_8_;
      auStack_1a0._16_8_ = (((secp256k1_gej *)r)->x).n[2] + auStack_1a0._16_8_;
      auStack_1a0._24_8_ = (((secp256k1_gej *)r)->x).n[3] + auStack_1a0._24_8_;
      auStack_1a0._32_8_ = auStack_1a0._32_8_ + (((secp256k1_gej *)r)->x).n[4];
      auStack_1a0._44_4_ = 0;
      psStack_2b8 = (secp256k1_gej *)0x119d92;
      auStack_1a0._40_4_ = iVar4;
      secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
      psVar12 = (secp256k1_gej *)&((secp256k1_gej *)r)->y;
      psStack_2b8 = (secp256k1_gej *)0x119da9;
      secp256k1_fe_mul((secp256k1_fe *)psVar12,(secp256k1_fe *)auStack_1a0,
                       (secp256k1_fe *)(auStack_200 + 0x30));
      a_05 = (secp256k1_gej *)(auStack_260 + 0x30);
      psStack_2b8 = (secp256k1_gej *)0x119dc1;
      a_02 = a_05;
      secp256k1_fe_mul((secp256k1_fe *)a_05,(secp256k1_fe *)a_05,(secp256k1_fe *)auStack_260);
      psStack_2b8 = (secp256k1_gej *)0x119dc9;
      secp256k1_fe_verify((secp256k1_fe *)psVar12);
      psStack_2b8 = (secp256k1_gej *)0x119dd1;
      a_03 = a_05;
      secp256k1_fe_verify((secp256k1_fe *)a_05);
      iStack_208 = iStack_208 + (((secp256k1_gej *)r)->y).magnitude;
      if (iStack_208 < 0x21) {
        uVar8 = (((secp256k1_gej *)r)->y).n[1];
        uVar2 = (((secp256k1_gej *)r)->y).n[2];
        uVar3 = (((secp256k1_gej *)r)->y).n[3];
        (((secp256k1_gej *)r)->y).n[0] = (((secp256k1_gej *)r)->y).n[0] + auStack_260._48_8_;
        (((secp256k1_gej *)r)->y).n[1] = uVar8 + uStack_228;
        (((secp256k1_gej *)r)->y).n[2] = uVar2 + uStack_220;
        (((secp256k1_gej *)r)->y).n[3] = uVar3 + uStack_218;
        puVar1 = (((secp256k1_gej *)r)->y).n + 4;
        *puVar1 = *puVar1 + uStack_210;
        (((secp256k1_gej *)r)->y).magnitude = iStack_208;
        (((secp256k1_gej *)r)->y).normalized = 0;
        goto LAB_0011974b;
      }
      goto LAB_00119f12;
    }
  }
  else {
    psStack_2b8 = (secp256k1_gej *)0x119ef9;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00119ef9:
    psStack_2b8 = (secp256k1_gej *)0x119efe;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_00119efe:
    psStack_2b8 = (secp256k1_gej *)0x119f03;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_00119f03:
    psStack_2b8 = (secp256k1_gej *)0x119f08;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_00119f08:
    psStack_2b8 = (secp256k1_gej *)0x119f0d;
    secp256k1_gej_add_zinv_var_cold_3();
  }
  psStack_2b8 = (secp256k1_gej *)0x119f12;
  secp256k1_gej_add_zinv_var_cold_2();
LAB_00119f12:
  psStack_2b8 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
  secp256k1_gej_add_zinv_var_cold_1();
  psStack_2d8 = (secp256k1_gej *)r;
  psStack_2d0 = r_00;
  psStack_2c8 = psVar11;
  psStack_2c0 = psVar12;
  psStack_2b8 = a_05;
  secp256k1_gej_verify(a_02);
  a_04 = a_01;
  secp256k1_fe_verify(&a_01->x);
  if (a_02->infinity != 0) {
    secp256k1_ge_set_gej_zinv_cold_1();
    a_04->infinity = 1;
    (a_04->x).magnitude = 0;
    (a_04->x).normalized = 1;
    (a_04->x).n[0] = 0;
    (a_04->x).n[1] = 0;
    (a_04->x).n[2] = 0;
    (a_04->x).n[3] = 0;
    (a_04->x).n[4] = 0;
    secp256k1_fe_verify(&a_04->x);
    (a_04->y).magnitude = 0;
    (a_04->y).normalized = 1;
    (a_04->y).n[0] = 0;
    (a_04->y).n[1] = 0;
    (a_04->y).n[2] = 0;
    (a_04->y).n[3] = 0;
    (a_04->y).n[4] = 0;
    secp256k1_fe_verify(&a_04->y);
    secp256k1_ge_verify(a_04);
    return;
  }
  secp256k1_fe_sqr(&sStack_308,&a_01->x);
  secp256k1_fe_mul(&sStack_338,&sStack_308,&a_01->x);
  secp256k1_fe_mul(&a_03->x,&a_02->x,&sStack_308);
  secp256k1_fe_mul(&a_03->y,&a_02->y,&sStack_338);
  *(int *)(a_03->z).n = a_02->infinity;
  secp256k1_ge_verify((secp256k1_ge *)a_03);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r, const secp256k1_ge_storage *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        secp256k1_ge_from_storage(r, &pre[(n-1)/2]);
    } else {
        secp256k1_ge_from_storage(r, &pre[(-n-1)/2]);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}